

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_UnsignedIntegerReturnValue_TestShell::
~TEST_MockReturnValueTest_UnsignedIntegerReturnValue_TestShell
          (TEST_MockReturnValueTest_UnsignedIntegerReturnValue_TestShell *this)

{
  TEST_MockReturnValueTest_UnsignedIntegerReturnValue_TestShell *this_local;
  
  ~TEST_MockReturnValueTest_UnsignedIntegerReturnValue_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockReturnValueTest, UnsignedIntegerReturnValue)
{
    unsigned int expected_value = 7;

    mock().expectOneCall("foo").andReturnValue(expected_value);

    MockActualCall& actual_call = mock().actualCall("foo");

    LONGS_EQUAL(expected_value, actual_call.returnValue().getUnsignedIntValue());
    LONGS_EQUAL(expected_value, actual_call.returnUnsignedIntValue());

    LONGS_EQUAL(expected_value, mock().returnValue().getUnsignedIntValue());
    LONGS_EQUAL(expected_value, mock().unsignedIntReturnValue());
}